

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

QList<QAbstractButton_*> * __thiscall
QDialogButtonBoxPrivate::allButtons
          (QList<QAbstractButton_*> *__return_storage_ptr__,QDialogButtonBoxPrivate *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QAbstractButton *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  visibleButtons(__return_storage_ptr__,this);
  QList<QAbstractButton_*>::reserve
            (__return_storage_ptr__,
             (this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s +
             (__return_storage_ptr__->d).size);
  lVar1 = (this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s;
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      local_38 = *(QAbstractButton **)
                  ((long)(this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.
                         super_QVLABaseBase.ptr + lVar2 * 8);
      QtPrivate::QPodArrayOps<QAbstractButton*>::emplace<QAbstractButton*&>
                ((QPodArrayOps<QAbstractButton*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_38);
      QList<QAbstractButton_*>::end(__return_storage_ptr__);
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAbstractButton *> QDialogButtonBoxPrivate::allButtons() const
{
    QList<QAbstractButton *> ret(visibleButtons());
    ret.reserve(ret.size() + hiddenButtons.size());
    for (const auto &it : hiddenButtons)
        ret.push_back(it.first);
    return ret;
}